

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

bool_t strIsAlphanumeric(char *str)

{
  char *str_local;
  
  str_local = str;
  while( true ) {
    if (*str_local == '\0') {
      return 1;
    }
    if ((((*str_local < '0') || ('9' < *str_local)) && ((*str_local < 'A' || ('Z' < *str_local))))
       && ((*str_local < 'a' || ('z' < *str_local)))) break;
    str_local = str_local + 1;
  }
  return 0;
}

Assistant:

bool_t strIsAlphanumeric(const char* str)
{
	ASSERT(strIsValid(str));
	for (; *str; ++str)
		if ((*str < '0' || *str > '9') &&
			(*str < 'A' || *str > 'Z') &&
			(*str < 'a' || *str > 'z'))
			return FALSE;
	return TRUE;
}